

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_exception.h
# Opt level: O2

void __thiscall cfd::core::CfdException::~CfdException(CfdException *this)

{
  *(undefined ***)this = &PTR__CfdException_006f9660;
  ::std::__cxx11::string::~string((string *)&this->message_);
  ::std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

_GLIBCXX_TXN_SAFE_DYN _GLIBCXX_USE_NOEXCEPT {
    // do nothing
  }